

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  __type _Var1;
  bool bVar2;
  reference pbVar3;
  string *in_RSI;
  long in_RDI;
  string les;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_name;
  string *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe28;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  long local_158;
  uint local_14c;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [48];
  string local_78 [32];
  string local_58 [32];
  string local_38 [55];
  byte local_1;
  
  ::std::__cxx11::string::string(local_38,(string *)(in_RDI + 8));
  if ((*(byte *)(in_RDI + 0x2d9) & 1) != 0) {
    ::std::__cxx11::string::string(local_78,(string *)(in_RDI + 8));
    detail::remove_underscore(in_stack_fffffffffffffe28);
    in_stack_fffffffffffffde0 = local_58;
    ::std::__cxx11::string::operator=(local_38,in_stack_fffffffffffffde0);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    ::std::__cxx11::string::~string(local_78);
    ::std::__cxx11::string::string(local_c8,in_RSI);
    detail::remove_underscore(in_stack_fffffffffffffe28);
    ::std::__cxx11::string::operator=(in_RSI,local_a8);
    ::std::__cxx11::string::~string(local_a8);
    ::std::__cxx11::string::~string(local_c8);
  }
  if ((*(byte *)(in_RDI + 0x2d8) & 1) != 0) {
    ::std::__cxx11::string::string(local_108,(string *)(in_RDI + 8));
    detail::to_lower(in_stack_fffffffffffffe18);
    in_stack_fffffffffffffdd8 = local_e8;
    ::std::__cxx11::string::operator=(local_38,in_stack_fffffffffffffdd8);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
    ::std::__cxx11::string::~string(local_108);
    ::std::__cxx11::string::string(local_148,in_RSI);
    detail::to_lower(in_stack_fffffffffffffe18);
    ::std::__cxx11::string::operator=(in_RSI,local_128);
    ::std::__cxx11::string::~string(local_128);
    ::std::__cxx11::string::~string(local_148);
  }
  _Var1 = ::std::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (_Var1) {
    local_1 = 1;
    local_14c = 1;
  }
  else {
    local_158 = in_RDI + 0x330;
    local_160._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffdd8);
    local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffdd8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffde0,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffdd8), bVar2) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_160);
      ::std::__cxx11::string::string(local_188,(string *)pbVar3);
      if ((*(byte *)(in_RDI + 0x2d9) & 1) != 0) {
        ::std::__cxx11::string::string(local_1c8,local_188);
        detail::remove_underscore(in_stack_fffffffffffffe28);
        ::std::__cxx11::string::operator=(local_188,local_1a8);
        ::std::__cxx11::string::~string(local_1a8);
        ::std::__cxx11::string::~string(local_1c8);
      }
      if ((*(byte *)(in_RDI + 0x2d8) & 1) != 0) {
        ::std::__cxx11::string::string((string *)&stack0xfffffffffffffdf8,local_188);
        detail::to_lower(in_stack_fffffffffffffe18);
        ::std::__cxx11::string::operator=(local_188,(string *)&stack0xfffffffffffffe18);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
      }
      _Var1 = ::std::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      if (_Var1) {
        local_1 = 1;
      }
      local_14c = (uint)_Var1;
      ::std::__cxx11::string::~string(local_188);
      if (local_14c != 0) goto LAB_0016df90;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_160);
    }
    local_1 = 0;
    local_14c = 1;
  }
LAB_0016df90:
  ::std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool App::check_name(std::string name_to_check) const {
    std::string local_name = name_;
    if(ignore_underscore_) {
        local_name = detail::remove_underscore(name_);
        name_to_check = detail::remove_underscore(name_to_check);
    }
    if(ignore_case_) {
        local_name = detail::to_lower(name_);
        name_to_check = detail::to_lower(name_to_check);
    }

    if(local_name == name_to_check) {
        return true;
    }
    for(std::string les : aliases_) {  // NOLINT(performance-for-range-copy)
        if(ignore_underscore_) {
            les = detail::remove_underscore(les);
        }
        if(ignore_case_) {
            les = detail::to_lower(les);
        }
        if(les == name_to_check) {
            return true;
        }
    }
    return false;
}